

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YinYang.cpp
# Opt level: O1

double __thiscall YinYang::coordinateY(YinYang *this,int J,int K,int L,int G)

{
  double dVar1;
  double dVar2;
  double local_18;
  
  if (G == 1) {
    this->theta1 = (double)J * this->d_theta1 + this->theta1_lb;
    dVar1 = (double)K * this->d_theta2 + this->theta2_lb;
    this->theta2 = dVar1;
    local_18 = -(this->super_Parameterization).radius;
  }
  else {
    if (G != 0) goto LAB_00104d0d;
    this->theta1 = (double)J * this->d_theta1 + this->theta1_lb;
    dVar1 = (double)K * this->d_theta2 + this->theta2_lb;
    this->theta2 = dVar1;
    local_18 = (this->super_Parameterization).radius;
  }
  dVar1 = sin(dVar1);
  dVar2 = cos(this->theta1);
  (this->super_Parameterization).y = dVar2 * dVar1 * local_18;
LAB_00104d0d:
  return (this->super_Parameterization).y;
}

Assistant:

double YinYang::coordinateY(int J, int K, int L, int G) {
  switch (G) {
    case 0:  // Yin
      theta1 = theta1_lb + (double)J * d_theta1;
      theta2 = theta2_lb + (double)K * d_theta2;
      y = radius * sin(theta2) * cos(theta1);
      break;
    case 1:  // Yang
      theta1 = theta1_lb + (double)J * d_theta1;
      theta2 = theta2_lb + (double)K * d_theta2;
      //y = radius * cos(theta2);
      y = -radius * sin(theta2) * cos(theta1);
      break;
  }

  return y;
}